

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O3

void formatFailMessage<unsigned_int,unsigned_int>
               (char *msg,size_t maxMsgLen,char *failureMsg,uint *val1,uint *val2,char *actual,
               char *expected,ComparisonOperation op)

{
  char *val1_00;
  char *val2_00;
  
  val1_00 = QTest::toString<unsigned_int>((uint *)failureMsg);
  val2_00 = QTest::toString<unsigned_int>(val1);
  formatFailMessage(msg,0x1000,(char *)maxMsgLen,val1_00,val2_00,(char *)val2,actual,CustomCompare);
  if (val1_00 != (char *)0x0) {
    operator_delete__(val1_00);
  }
  if (val2_00 != (char *)0x0) {
    operator_delete__(val2_00);
    return;
  }
  return;
}

Assistant:

static Q_DECL_COLD_FUNCTION
void formatFailMessage(char *msg, size_t maxMsgLen,
                       const char *failureMsg,
                       const Actual &val1, const Expected &val2,
                       const char *actual, const char *expected,
                       QTest::ComparisonOperation op)
{
    const char *val1S = QTest::toString(val1);
    const char *val2S = QTest::toString(val2);

    formatFailMessage(msg, maxMsgLen, failureMsg, val1S, val2S, actual, expected, op);

    delete [] val1S;
    delete [] val2S;
}